

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_ostream.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Option *this;
  ostream *poVar1;
  long lVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>
  __l;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_56e;
  allocator_type local_56d;
  Level level;
  Level local_568;
  Level local_564;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  map;
  undefined1 local_490 [80];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  local_440;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  local_418;
  Validator local_3e8;
  App app;
  
  std::__cxx11::string::string((string *)&local_4e0,"",(allocator *)local_490);
  std::__cxx11::string::string((string *)&local_500,"",(allocator *)&map);
  CLI::App::App(&app,&local_4e0,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_4e0);
  level = Low;
  local_560._M_dataplus._M_p._0_4_ = 0;
  CLI::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  ::pair<const_char_(&)[5],_Level,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
              *)local_490,(char (*) [5])"high",(Level *)&local_560);
  local_564 = Medium;
  CLI::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  ::pair<const_char_(&)[7],_Level,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
              *)(local_490 + 0x28),(char (*) [7])"medium",&local_564);
  local_568 = Low;
  CLI::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>
  ::pair<const_char_(&)[4],_Level,_true>(&local_440,(char (*) [4])"low",&local_568);
  __l._M_len = 3;
  __l._M_array = (iterator)local_490;
  CLI::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::map(&map,__l,&local_56e,&local_56d);
  lVar2 = 0x50;
  do {
    std::__cxx11::string::~string((string *)(local_490 + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  std::__cxx11::string::string((string *)&local_520,"-l,--level",(allocator *)&local_564);
  std::__cxx11::string::string((string *)&local_540,"Level settings",(allocator *)&local_568);
  this = CLI::App::add_option<Level,_Level,_(CLI::detail::enabler)0>
                   (&app,&local_520,&level,&local_540);
  (this->super_OptionBase<CLI::Option>).required_ = true;
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::_Rb_tree(&local_418,&map._M_t);
  CLI::CheckedTransformer::
  CheckedTransformer<std::map<std::__cxx11::string,Level,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Level>>>,std::__cxx11::string(*)(std::__cxx11::string)>
            ((CheckedTransformer *)local_490,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
              *)&local_418,CLI::ignore_case);
  CLI::Validator::Validator(&local_3e8,(Validator *)local_490);
  std::__cxx11::string::string((string *)&local_560,"",(allocator *)&local_56e);
  CLI::Option::transform(this,&local_3e8,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  CLI::Validator::~Validator(&local_3e8);
  CLI::Validator::~Validator((Validator *)local_490);
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::~_Rb_tree(&local_418);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_520);
  CLI::App::parse_char_t<char>(&app,argc,argv);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enum received: ");
  poVar1 = operator<<(poVar1,&level);
  std::operator<<(poVar1,'\n');
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::~_Rb_tree(&map._M_t);
  CLI::App::~App(&app);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app;

    Level level{Level::Low};
    // specify string->value mappings
    std::map<std::string, Level> map{{"high", Level::High}, {"medium", Level::Medium}, {"low", Level::Low}};
    // CheckedTransformer translates and checks whether the results are either in one of the strings or in one of the
    // translations already
    app.add_option("-l,--level", level, "Level settings")
        ->required()
        ->transform(CLI::CheckedTransformer(map, CLI::ignore_case));

    CLI11_PARSE(app, argc, argv);

    // CLI11's built in enum streaming can be used outside CLI11 like this:
    using CLI::enums::operator<<;
    std::cout << "Enum received: " << level << '\n';

    return 0;
}